

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::NeuralNetworkLayer::Clear(NeuralNetworkLayer *this)

{
  uint32_t cached_has_bits;
  NeuralNetworkLayer *this_local;
  
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->input_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&this->output_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Clear(&this->inputtensor_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::Clear(&this->outputtensor_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->name_);
  this->isupdatable_ = false;
  clear_layer(this);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void NeuralNetworkLayer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NeuralNetworkLayer)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  input_.Clear();
  output_.Clear();
  inputtensor_.Clear();
  outputtensor_.Clear();
  name_.ClearToEmpty();
  isupdatable_ = false;
  clear_layer();
  _internal_metadata_.Clear<std::string>();
}